

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O0

int stbi_info_from_file(FILE *f,int *x,int *y,int *comp)

{
  long __off;
  long pos;
  stbi__context s;
  int r;
  int *comp_local;
  int *y_local;
  int *x_local;
  FILE *f_local;
  
  __off = ftell((FILE *)f);
  stbi__start_file((stbi__context *)&pos,f);
  s.img_buffer_original_end._4_4_ = stbi__info_main((stbi__context *)&pos,x,y,comp);
  fseek((FILE *)f,__off,0);
  return s.img_buffer_original_end._4_4_;
}

Assistant:

STBIDEF int stbi_info_from_file(FILE *f, int *x, int *y, int *comp)
{
   int r;
   stbi__context s;
   long pos = ftell(f);
   stbi__start_file(&s, f);
   r = stbi__info_main(&s,x,y,comp);
   fseek(f,pos,SEEK_SET);
   return r;
}